

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::test_multiple_outputs1(APITests *this)

{
  void *pvVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  vector<int,_std::allocator<int>_> channels;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  undefined8 local_28;
  void *local_20 [2];
  long local_10;
  
  GPIO::setmode(BOARD);
  local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = (this->pin_data).out_a;
  local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _4_4_ = (this->pin_data).out_b;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,(allocator_type *)&local_28);
  GPIO::setup((vector *)local_20,OUT,-1);
  local_28 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_00,&local_41);
  GPIO::output((vector *)local_20,(vector *)&local_40);
  pvVar1 = (void *)CONCAT44(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  local_28 = 0x100000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_01,&local_41);
  GPIO::output((vector *)local_20,(vector *)&local_40);
  pvVar1 = (void *)CONCAT44(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  GPIO::cleanup();
  if (local_20[0] != (void *)0x0) {
    operator_delete(local_20[0],local_10 - (long)local_20[0]);
  }
  return;
}

Assistant:

void test_multiple_outputs1()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, {GPIO::HIGH, GPIO::LOW});
        GPIO::output(channels, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }